

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O3

void __thiscall
AutoArgParse::MissingMandatoryArgException::MissingMandatoryArgException
          (MissingMandatoryArgException *this,FlagStore *flagStore)

{
  FlagStore *in_RDX;
  string local_38;
  
  makeErrorMessage_abi_cxx11_(&local_38,(MissingMandatoryArgException *)flagStore,in_RDX);
  ParseException::ParseException(&this->super_ParseException,MISSING_MANDATORY_ARG,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_ParseException = &PTR__ParseException_00111a88;
  this->flagStore = flagStore;
  return;
}

Assistant:

MissingMandatoryArgException(const FlagStore& flagStore)
        : ParseException(MISSING_MANDATORY_ARG, makeErrorMessage(flagStore)),
          flagStore(flagStore) {}